

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     BinaryUpdateLoop<duckdb::RegrInterceptState,double,double,duckdb::RegrInterceptOperation>
               (double *adata,AggregateInputData *aggr_input_data,double *bdata,
               RegrInterceptState *state,idx_t count,SelectionVector *asel,SelectionVector *bsel,
               ValidityMask *avalidity,ValidityMask *bvalidity)

{
  double dVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  AggregateBinaryInput local_58;
  
  local_58.left_mask = avalidity;
  local_58.right_mask = bvalidity;
  local_58.input = aggr_input_data;
  if ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      uVar3 = 0;
      do {
        local_58.lidx = uVar3;
        if (asel->sel_vector != (sel_t *)0x0) {
          local_58.lidx = (idx_t)asel->sel_vector[uVar3];
        }
        local_58.ridx = uVar3;
        if (bsel->sel_vector != (sel_t *)0x0) {
          local_58.ridx = (idx_t)bsel->sel_vector[uVar3];
        }
        state->count = state->count + 1;
        dVar1 = adata[local_58.lidx];
        state->sum_x = bdata[local_58.ridx] + state->sum_x;
        state->sum_y = dVar1 + state->sum_y;
        RegrSlopeOperation::
        Operation<double,double,duckdb::RegrSlopeState,duckdb::RegrInterceptOperation>
                  (&state->slope,adata + local_58.lidx,bdata + local_58.ridx,&local_58);
        uVar3 = uVar3 + 1;
      } while (count != uVar3);
    }
  }
  else if (count != 0) {
    uVar3 = 0;
    do {
      local_58.lidx = uVar3;
      if (asel->sel_vector != (sel_t *)0x0) {
        local_58.lidx = (idx_t)asel->sel_vector[uVar3];
      }
      local_58.ridx = uVar3;
      if (bsel->sel_vector != (sel_t *)0x0) {
        local_58.ridx = (idx_t)bsel->sel_vector[uVar3];
      }
      puVar2 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar2 == (unsigned_long *)0x0) ||
          ((puVar2[local_58.lidx >> 6] >> (local_58.lidx & 0x3f) & 1) != 0)) &&
         ((puVar2 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar2 == (unsigned_long *)0x0 ||
          ((puVar2[local_58.ridx >> 6] >> (local_58.ridx & 0x3f) & 1) != 0)))) {
        state->count = state->count + 1;
        dVar1 = adata[local_58.lidx];
        state->sum_x = bdata[local_58.ridx] + state->sum_x;
        state->sum_y = dVar1 + state->sum_y;
        RegrSlopeOperation::
        Operation<double,double,duckdb::RegrSlopeState,duckdb::RegrInterceptOperation>
                  (&state->slope,adata + local_58.lidx,bdata + local_58.ridx,&local_58);
      }
      uVar3 = uVar3 + 1;
    } while (count != uVar3);
  }
  return;
}

Assistant:

static inline void BinaryUpdateLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                    const B_TYPE *__restrict bdata, STATE_TYPE *__restrict state, idx_t count,
	                                    const SelectionVector &asel, const SelectionVector &bsel,
	                                    ValidityMask &avalidity, ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
					                                                       input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
				                                                       input);
			}
		}
	}